

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O1

void qt_QMetaEnum_flagDebugOperator<unsigned_long_long>
               (QDebug *debug,size_t sizeofT,unsigned_long_long value)

{
  Stream *this;
  storage_type *in_RCX;
  bool bVar1;
  ulong uVar2;
  bool bVar3;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QDebugStateSaver saver;
  QDebugStateSaver local_58;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&local_58,debug);
  QTextStream::reset(&debug->stream->ts);
  this = debug->stream;
  this->verbosity = 2;
  this->space = false;
  this->noQuotes = false;
  ba.m_data = in_RCX;
  ba.m_size = (qsizetype)"QFlags(";
  QString::fromUtf8(&local_50,(QString *)&DAT_00000007,ba);
  QTextStream::operator<<(&this->ts,&local_50);
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (debug->stream->space == true) {
    QTextStream::operator<<(&debug->stream->ts,' ');
  }
  Qt::hex(&debug->stream->ts);
  Qt::showbase(&debug->stream->ts);
  if (sizeofT << 3 != 0) {
    uVar2 = 0;
    bVar1 = false;
    do {
      if ((value >> (uVar2 & 0x3f) & 1) != 0) {
        bVar3 = true;
        if (bVar1) {
          QTextStream::operator<<(&debug->stream->ts,'|');
          bVar3 = bVar1;
          if (debug->stream->space == true) {
            QTextStream::operator<<(&debug->stream->ts,' ');
          }
        }
        QTextStream::operator<<(&debug->stream->ts,1L << ((byte)uVar2 & 0x3f));
        bVar1 = bVar3;
        if (debug->stream->space == true) {
          QTextStream::operator<<(&debug->stream->ts,' ');
        }
      }
      uVar2 = uVar2 + 1;
    } while (sizeofT << 3 != uVar2);
  }
  QTextStream::operator<<(&debug->stream->ts,')');
  if (debug->stream->space == true) {
    QTextStream::operator<<(&debug->stream->ts,' ');
  }
  QDebugStateSaver::~QDebugStateSaver(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void qt_QMetaEnum_flagDebugOperator(QDebug &debug, size_t sizeofT, Int value)
{
    static_assert(std::is_unsigned_v<Int>,
            "Cast value to an unsigned type before calling this function");
    const QDebugStateSaver saver(debug);
    debug.resetFormat();
    debug.nospace() << "QFlags(" << Qt::hex << Qt::showbase;
    bool needSeparator = false;
    for (size_t i = 0; i < sizeofT * 8; ++i) {
        if (value & (Int(1) << i)) {
            if (needSeparator)
                debug << '|';
            else
                needSeparator = true;
            debug << (Int(1) << i);
        }
    }
    debug << ')';
}